

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

int __thiscall
QMessageBoxDetailsText::copy(QMessageBoxDetailsText *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  uint uVar1;
  bool bVar2;
  
  bVar2 = (this->copyAvailable & 1U) != 0;
  if (bVar2) {
    uVar1 = QTextEdit::copy(&this->textEdit->super_QTextEdit,dst,src);
    this = (QMessageBoxDetailsText *)(ulong)uVar1;
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),bVar2);
}

Assistant:

bool copy()
    {
#ifdef QT_NO_CLIPBOARD
        return false;
#else
        if (!copyAvailable)
            return false;
        textEdit->copy();
        return true;
#endif
    }